

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::ParseBigVarint(char *p,uint64 *out)

{
  uint32 uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *pnew;
  long local_38;
  
  pnew = p;
  uVar1 = DecodeTwoBytes(&pnew);
  uVar2 = (ulong)(uVar1 >> 1);
  if ((short)uVar1 < 0) {
    lVar3 = 0xd;
    pcVar4 = p + 2;
    do {
      local_38 = lVar3 + 0xe;
      if (local_38 == 0x53) {
        return (char *)0x0;
      }
      pnew = pcVar4;
      uVar1 = DecodeTwoBytes(&pnew);
      uVar2 = uVar2 + ((ulong)uVar1 - 2 << ((byte)lVar3 & 0x3f));
      lVar3 = local_38;
      pcVar4 = pcVar4 + 2;
    } while ((short)uVar1 < 0);
  }
  *out = uVar2;
  return pnew;
}

Assistant:

inline const char* ParseBigVarint(const char* p, uint64* out) {
  auto pnew = p;
  auto tmp = DecodeTwoBytes(&pnew);
  uint64 res = tmp >> 1;
  if (PROTOBUF_PREDICT_TRUE(std::int16_t(tmp) >= 0)) {
    *out = res;
    return pnew;
  }
  for (std::uint32_t i = 1; i < 5; i++) {
    pnew = p + 2 * i;
    tmp = DecodeTwoBytes(&pnew);
    res += (static_cast<std::uint64_t>(tmp) - 2) << (14 * i - 1);
    if (PROTOBUF_PREDICT_TRUE(std::int16_t(tmp) >= 0)) {
      *out = res;
      return pnew;
    }
  }
  return nullptr;
}